

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGlobalTarget(cmGlobalGenerator *this,GlobalTargetInfo *gti,cmMakefile *mf)

{
  bool bVar1;
  uint uVar2;
  cmTarget *pcVar3;
  char *workingDirectory;
  ulong uVar4;
  pair<cmTarget_&,_bool> pVar5;
  string local_260;
  allocator<char> local_239;
  string local_238;
  reference local_218;
  string *d;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1f0;
  cmCustomCommandLines local_1d0;
  undefined1 local_1b8 [8];
  cmCustomCommand cc;
  allocator<char> local_69;
  string local_68;
  cmTarget *local_48;
  cmTarget *target;
  undefined1 local_38;
  cmTarget *local_30;
  pair<cmTarget_&,_bool> tb;
  cmMakefile *mf_local;
  GlobalTargetInfo *gti_local;
  cmGlobalGenerator *this_local;
  
  tb._8_8_ = mf;
  pVar5 = cmMakefile::CreateNewTarget(mf,&gti->Name,GLOBAL_TARGET,gti->PerConfig);
  pcVar3 = pVar5.first;
  local_38 = pVar5.second;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_48 = pcVar3;
    target = pcVar3;
    local_30 = pcVar3;
    tb.first._0_1_ = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"EXCLUDE_FROM_ALL",&local_69);
    cmTarget::SetProperty(pcVar3,&local_68,"TRUE");
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    cmCustomCommand::cmCustomCommand((cmCustomCommand *)local_1b8);
    cmCustomCommandLines::cmCustomCommandLines(&local_1d0,&gti->CommandLines);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)local_1b8,&local_1d0);
    cmCustomCommandLines::~cmCustomCommandLines(&local_1d0);
    workingDirectory = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_1b8,workingDirectory);
    cmCustomCommand::SetStdPipesUTF8((cmCustomCommand *)local_1b8,(bool)(gti->StdPipesUTF8 & 1));
    cmCustomCommand::SetUsesTerminal((cmCustomCommand *)local_1b8,(bool)(gti->UsesTerminal & 1));
    cmTarget::AddPostBuildCommand(local_48,(cmCustomCommand *)local_1b8);
    uVar4 = std::__cxx11::string::empty();
    pcVar3 = local_48;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"EchoString",(allocator<char> *)((long)&__range1 + 7));
      cmTarget::SetProperty(pcVar3,&local_1f0,&gti->Message);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&gti->Depends);
    d = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&gti->Depends);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&d), bVar1) {
      local_218 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      cmTarget::AddUtility(local_48,local_218,false,(cmMakefile *)0x0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    uVar2 = (*this->_vptr_cmGlobalGenerator[0x2c])();
    pcVar3 = local_48;
    if ((uVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"FOLDER",&local_239);
      GetPredefinedTargetsFolder_abi_cxx11_(&local_260,this);
      cmTarget::SetProperty(pcVar3,&local_238,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_1b8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGlobalTarget(GlobalTargetInfo const& gti,
                                           cmMakefile* mf)
{
  // Package
  auto tb =
    mf->CreateNewTarget(gti.Name, cmStateEnums::GLOBAL_TARGET, gti.PerConfig);

  // Do nothing if gti.Name is already used
  if (!tb.second) {
    return;
  }

  cmTarget& target = tb.first;
  target.SetProperty("EXCLUDE_FROM_ALL", "TRUE");

  // Store the custom command in the target.
  cmCustomCommand cc;
  cc.SetCommandLines(gti.CommandLines);
  cc.SetWorkingDirectory(gti.WorkingDir.c_str());
  cc.SetStdPipesUTF8(gti.StdPipesUTF8);
  cc.SetUsesTerminal(gti.UsesTerminal);
  target.AddPostBuildCommand(std::move(cc));
  if (!gti.Message.empty()) {
    target.SetProperty("EchoString", gti.Message);
  }
  for (std::string const& d : gti.Depends) {
    target.AddUtility(d, false);
  }

  // Organize in the "predefined targets" folder:
  //
  if (this->UseFolderProperty()) {
    target.SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
  }
}